

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test::
~TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test
          (TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test *this)

{
  TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test *this_local;
  
  ~TEST_CommandLineArguments_setCompleteStrictGroupDotNameFilter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setCompleteStrictGroupDotNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-st", "group.name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
    TestFilter nameFilter("name");
    nameFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}